

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

bool __thiscall slang::ast::CallExpression::hasOutputArgs(CallExpression *this)

{
  char *pcVar1;
  SystemSubroutine *pSVar2;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  SubroutineSymbol *symbol;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *callInfo;
  SubroutineSymbol *in_stack_00000030;
  bool local_1;
  
  pcVar1 = std::
           variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
           ::index((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                    *)(in_RDI + 0x30),in_RSI,in_EDX);
  if (pcVar1 == (char *)0x1) {
    std::get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
              ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                *)0xa0261e);
    pSVar2 = not_null<const_slang::ast::SystemSubroutine_*>::operator->
                       ((not_null<const_slang::ast::SystemSubroutine_*> *)0xa0262d);
    local_1 = (bool)(pSVar2->hasOutputArgs & 1);
  }
  else {
    std::get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
              ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                *)0xa02645);
    local_1 = SubroutineSymbol::hasOutputArgs(in_stack_00000030);
  }
  return local_1;
}

Assistant:

bool CallExpression::hasOutputArgs() const {
    if (subroutine.index() == 1) {
        auto& callInfo = std::get<1>(subroutine);
        return callInfo.subroutine->hasOutputArgs;
    }

    const SubroutineSymbol& symbol = *std::get<0>(subroutine);
    return symbol.hasOutputArgs();
}